

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx *dctx,ZSTD_dParameter dParam,int value)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = 0xffffffffffffffc4;
  if (dctx->streamStage == zdss_init) {
    switch(dParam) {
    case ZSTD_d_experimentalParam1:
      sVar1 = 0xffffffffffffffd6;
      if ((uint)value < 2) {
        dctx->format = value;
        return 0;
      }
      break;
    case ZSTD_d_experimentalParam2:
      sVar1 = 0xffffffffffffffd6;
      if ((uint)value < 2) {
        dctx->outBufferMode = value;
        return 0;
      }
      break;
    case ZSTD_d_experimentalParam3:
      sVar1 = 0xffffffffffffffd6;
      if ((uint)value < 2) {
        dctx->forceIgnoreChecksum = value;
        return 0;
      }
      break;
    case ZSTD_d_experimentalParam4:
      sVar1 = 0xffffffffffffffd6;
      if (((uint)value < 2) && (sVar1 = 0xffffffffffffffd8, dctx->staticSize == 0)) {
        dctx->refMultipleDDicts = value;
        return 0;
      }
      break;
    case ZSTD_d_experimentalParam5:
      sVar1 = 0xffffffffffffffd6;
      if ((uint)value < 2) {
        dctx->disableHufAsm = value;
        return 0;
      }
      break;
    default:
      sVar1 = 0xffffffffffffffd8;
      if (dParam == ZSTD_d_windowLogMax) {
        iVar2 = 0x1b;
        if (value != 0) {
          iVar2 = value;
        }
        sVar1 = 0xffffffffffffffd6;
        if (0xffffffe9 < iVar2 - 0x20U) {
          dctx->maxWindowSize = 1L << ((byte)iVar2 & 0x3f);
          return 0;
        }
      }
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_DCtx_setParameter(ZSTD_DCtx* dctx, ZSTD_dParameter dParam, int value)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            if (value == 0) value = ZSTD_WINDOWLOG_LIMIT_DEFAULT;
            CHECK_DBOUNDS(ZSTD_d_windowLogMax, value);
            dctx->maxWindowSize = ((size_t)1) << value;
            return 0;
        case ZSTD_d_format:
            CHECK_DBOUNDS(ZSTD_d_format, value);
            dctx->format = (ZSTD_format_e)value;
            return 0;
        case ZSTD_d_stableOutBuffer:
            CHECK_DBOUNDS(ZSTD_d_stableOutBuffer, value);
            dctx->outBufferMode = (ZSTD_bufferMode_e)value;
            return 0;
        case ZSTD_d_forceIgnoreChecksum:
            CHECK_DBOUNDS(ZSTD_d_forceIgnoreChecksum, value);
            dctx->forceIgnoreChecksum = (ZSTD_forceIgnoreChecksum_e)value;
            return 0;
        case ZSTD_d_refMultipleDDicts:
            CHECK_DBOUNDS(ZSTD_d_refMultipleDDicts, value);
            if (dctx->staticSize != 0) {
                RETURN_ERROR(parameter_unsupported, "Static dctx does not support multiple DDicts!");
            }
            dctx->refMultipleDDicts = (ZSTD_refMultipleDDicts_e)value;
            return 0;
        case ZSTD_d_disableHuffmanAssembly:
            CHECK_DBOUNDS(ZSTD_d_disableHuffmanAssembly, value);
            dctx->disableHufAsm = value != 0;
            return 0;
        default:;
    }
    RETURN_ERROR(parameter_unsupported, "");
}